

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

bool __thiscall Matrix::MultiplyColumn(Matrix *this,int column,Fraction coefficient)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  int row;
  long lVar5;
  Fraction local_40;
  Fraction local_38;
  
  local_40 = coefficient;
  Fraction::Fraction(&local_38,1);
  bVar2 = operator==(&local_40,&local_38);
  bVar3 = false;
  if ((!bVar2) && (bVar3 = false, 0 < this->n_)) {
    lVar4 = 0;
    lVar5 = 0;
    bVar3 = false;
    do {
      lVar1 = *(long *)((long)&(((this->elements_).
                                 super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<Fraction,_std::allocator<Fraction>_>)._M_impl.
                               super__Vector_impl_data + lVar4);
      Fraction::Fraction(&local_38,0);
      bVar2 = operator!=((Fraction *)(lVar1 + (long)column * 8),&local_38);
      if (bVar2) {
        Fraction::operator*=
                  ((Fraction *)
                   (*(long *)((long)&(((this->elements_).
                                       super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<Fraction,_std::allocator<Fraction>_>).
                                     _M_impl.super__Vector_impl_data + lVar4) + (long)column * 8),
                   &local_40);
        bVar3 = true;
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x18;
    } while (lVar5 < this->n_);
  }
  return bVar3;
}

Assistant:

bool Matrix::MultiplyColumn(int column, Fraction coefficient) {
  if (coefficient == 1) {
    return false;
  }

  int result = false;
  for (int row = 0; row < n_; ++row) {
    if (elements_[row][column] != 0) {
      result = true;
      elements_[row][column] *= coefficient;
    }
  }

  return result;
}